

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall IlmThread_2_5::anon_unknown_5::DefaultWorkerThread::run(DefaultWorkerThread *this)

{
  __int_type_conflict1 _Var1;
  DefaultWorkData *pDVar2;
  pointer ppTVar3;
  Task *pTVar4;
  TaskGroup *pTVar5;
  Data *pDVar6;
  int iVar7;
  void *in_RSI;
  Semaphore *this_00;
  Mutex *__mutex;
  
  this_00 = &this->_data->threadSemaphore;
  do {
    Semaphore::post(this_00);
    do {
      while( true ) {
        Semaphore::wait(&this->_data->taskSemaphore,in_RSI);
        __mutex = &this->_data->taskMutex;
        iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar7 != 0) {
          std::__throw_system_error(iVar7);
        }
        pDVar2 = this->_data;
        ppTVar3 = (pDVar2->tasks).
                  super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((pDVar2->tasks).
            super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>.
            _M_impl.super__Vector_impl_data._M_start != ppTVar3) break;
        _Var1 = (pDVar2->stopping)._M_base._M_i;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if ((_Var1 & 1U) != 0) {
          return;
        }
      }
      pTVar4 = ppTVar3[-1];
      (pDVar2->tasks).
      super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar3 + -1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pTVar5 = pTVar4->_group;
      (*pTVar4->_vptr_Task[2])(pTVar4);
      (*pTVar4->_vptr_Task[1])(pTVar4);
      pDVar6 = pTVar5->_data;
      LOCK();
      (pDVar6->numPending).super___atomic_base<int>._M_i =
           (pDVar6->numPending).super___atomic_base<int>._M_i + -1;
      UNLOCK();
    } while ((pDVar6->numPending).super___atomic_base<int>._M_i != 0);
    this_00 = &pDVar6->isEmpty;
  } while( true );
}

Assistant:

void
DefaultWorkerThread::run ()
{
    //
    // Signal that the thread has started executing
    //

    _data->threadSemaphore.post();

    while (true)
    {
        //
        // Wait for a task to become available
        //

        _data->taskSemaphore.wait();

        {
            Lock taskLock (_data->taskMutex);
    
            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!_data->tasks.empty())
            {
                Task* task = _data->tasks.back();
                _data->tasks.pop_back();
                taskLock.release();

                TaskGroup* taskGroup = task->group();
                task->execute();

                delete task;

                taskGroup->_data->removeTask ();
            }
            else if (_data->stopped())
            {
                break;
            }
        }
    }
}